

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O3

HIST_ENTRY * next_history(void)

{
  int iVar1;
  HIST_ENTRY *pHVar2;
  HistEvent ev;
  HistEvent_conflict HStack_18;
  
  if (history_offset < history_length) {
    pHVar2 = (HIST_ENTRY *)0x0;
    iVar1 = history(h,&HStack_18,4);
    if (iVar1 == 0) {
      history_offset = history_offset + L'\x01';
      pHVar2 = current_history();
    }
  }
  else {
    pHVar2 = (HIST_ENTRY *)0x0;
  }
  return pHVar2;
}

Assistant:

HIST_ENTRY *
next_history(void)
{
	HistEvent ev;

	if (history_offset >= history_length)
		return NULL;

	if (history(h, &ev, H_LAST) != 0)
		return NULL;

	history_offset++;
	return current_history();
}